

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

void Ifn_NtkAddConstrOne(sat_solver *pSat,Vec_Int_t *vCover,int *pVars,int nVars)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int local_68 [2];
  int pLits [11];
  int nLits;
  int Literal;
  int Cube;
  int c;
  int k;
  int RetValue;
  int nVars_local;
  int *pVars_local;
  Vec_Int_t *vCover_local;
  sat_solver *pSat_local;
  
  Literal = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCover);
    if (iVar1 <= Literal) {
      return;
    }
    iVar1 = Vec_IntEntry(vCover,Literal);
    pLits[9] = 0;
    for (Cube = 0; Cube < nVars; Cube = Cube + 1) {
      pLits[10] = iVar1 >> ((byte)(Cube << 1) & 0x1f) & 3;
      if (pLits[10] == 1) {
        iVar2 = Abc_Var2Lit(pVars[Cube],0);
        lVar3 = (long)pLits[9];
        pLits[9] = pLits[9] + 1;
        pLits[lVar3 + -2] = iVar2;
      }
      else if (pLits[10] == 2) {
        iVar2 = Abc_Var2Lit(pVars[Cube],1);
        lVar3 = (long)pLits[9];
        pLits[9] = pLits[9] + 1;
        pLits[lVar3 + -2] = iVar2;
      }
      else if (pLits[10] != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x417,"void Ifn_NtkAddConstrOne(sat_solver *, Vec_Int_t *, int *, int)");
      }
    }
    iVar1 = Ifn_AddClause(pSat,local_68,pLits + (long)pLits[9] + -2);
    if (iVar1 == 0) break;
    Literal = Literal + 1;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x41a,"void Ifn_NtkAddConstrOne(sat_solver *, Vec_Int_t *, int *, int)");
}

Assistant:

void Ifn_NtkAddConstrOne( sat_solver * pSat, Vec_Int_t * vCover, int * pVars, int nVars )
{
    int RetValue, k, c, Cube, Literal, nLits, pLits[IFN_INS];
    Vec_IntForEachEntry( vCover, Cube, c )
    {
        nLits = 0;
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Cube >> (k << 1));
            if ( Literal == 1 )      // '0'  -> pos lit
                pLits[nLits++] = Abc_Var2Lit(pVars[k], 0);
            else if ( Literal == 2 ) // '1'  -> neg lit
                pLits[nLits++] = Abc_Var2Lit(pVars[k], 1);
            else if ( Literal != 0 )
                assert( 0 );
        }
        RetValue = Ifn_AddClause( pSat, pLits, pLits + nLits );
        assert( RetValue );
    }
}